

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

cio_error cio_timer_init(cio_timer *timer,cio_eventloop *loop,cio_timer_close_hook_t close_hook)

{
  int __fd;
  int *piVar1;
  cio_error local_30;
  cio_error ret_val;
  int fd;
  cio_timer_close_hook_t close_hook_local;
  cio_eventloop *loop_local;
  cio_timer *timer_local;
  
  __fd = timerfd_create(1,0x800);
  if (__fd == -1) {
    piVar1 = __errno_location();
    timer_local._4_4_ = -*piVar1;
  }
  else {
    timer->close_hook = close_hook;
    timer->handler = (cio_timer_handler_t)0x0;
    timer->handler_context = (void *)0x0;
    (timer->impl).loop = loop;
    (timer->impl).ev.read_callback = timer_read;
    (timer->impl).ev.write_callback = (_func_void_void_ptr_cio_epoll_error *)0x0;
    (timer->impl).ev.fd = __fd;
    local_30 = cio_linux_eventloop_add((timer->impl).loop,&(timer->impl).ev);
    if (local_30 == CIO_SUCCESS) {
      local_30 = cio_linux_eventloop_register_read((timer->impl).loop,&(timer->impl).ev);
      if (local_30 == CIO_SUCCESS) {
        return CIO_SUCCESS;
      }
      cio_linux_eventloop_remove((timer->impl).loop,&(timer->impl).ev);
    }
    close(__fd);
    timer_local._4_4_ = local_30;
  }
  return timer_local._4_4_;
}

Assistant:

enum cio_error cio_timer_init(struct cio_timer *timer, struct cio_eventloop *loop,
                              cio_timer_close_hook_t close_hook)
{
	int fd = timerfd_create(CLOCK_MONOTONIC, O_NONBLOCK);
	if (cio_unlikely(fd == -1)) {
		return (enum cio_error)(-errno);
	}

	timer->close_hook = close_hook;
	timer->handler = NULL;
	timer->handler_context = NULL;
	timer->impl.loop = loop;

	timer->impl.ev.read_callback = timer_read;
	timer->impl.ev.write_callback = NULL;
	timer->impl.ev.fd = fd;

	enum cio_error ret_val = cio_linux_eventloop_add(timer->impl.loop, &timer->impl.ev);
	if (cio_unlikely(ret_val != CIO_SUCCESS)) {
		goto eventloop_add_failed;
	}

	ret_val = cio_linux_eventloop_register_read(timer->impl.loop, &timer->impl.ev);
	if (cio_unlikely(ret_val != CIO_SUCCESS)) {
		goto register_read_failed;
	}

	return ret_val;

register_read_failed:
	cio_linux_eventloop_remove(timer->impl.loop, &timer->impl.ev);
eventloop_add_failed:
	close(fd);
	return ret_val;
}